

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O2

PropertyQueryFlags __thiscall
Js::CustomExternalWrapperObject::HasPropertyQuery
          (CustomExternalWrapperObject *this,PropertyId propertyId,PropertyValueInfo *info)

{
  undefined1 uVar1;
  byte bVar2;
  ScriptContext *pSVar3;
  Var pvVar4;
  bool bVar5;
  BOOL BVar6;
  PropertyQueryFlags PVar7;
  Attributes attributes;
  HostScriptContext *pHVar8;
  JavascriptFunction *function;
  RecyclableObject *ptr;
  ScriptContext *this_00;
  anon_class_48_6_c05621ac local_78;
  Var local_48;
  Var isPropertyNameNumeric;
  Var propertyNameNumericValue;
  
  pSVar3 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  bVar5 = false;
  ThreadContext::ProbeStack(pSVar3->threadContext,0xc00,pSVar3,(PVOID)0x0);
  propertyNameNumericValue =
       ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
        super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  pHVar8 = ThreadContext::GetPreviousHostScriptContext((ThreadContext *)propertyNameNumericValue);
  pSVar3 = pHVar8->scriptContext;
  BVar6 = EnsureInitialized(this,pSVar3);
  if (BVar6 == 0) goto LAB_00a0e46e;
  pvVar4 = *(Var *)&((this->super_DynamicObject).super_RecyclableObject.type.ptr[1].propertyCache.
                    ptr)->elements[2].field_0x8;
  if (pvVar4 != (Var)0x0) {
    function = VarTo<Js::JavascriptFunction>(pvVar4);
    if (function != (JavascriptFunction *)0x0) {
      this_00 = pSVar3;
      bVar5 = ScriptContext::IsHeapEnumInProgress(pSVar3);
      if (!bVar5) {
        local_78.propertyName =
             GetName((CustomExternalWrapperObject *)this_00,pSVar3,propertyId,&local_48,
                     &isPropertyNameNumeric);
        pvVar4 = propertyNameNumericValue;
        if (info != (PropertyValueInfo *)0x0) {
          info->m_instance = (RecyclableObject *)this;
          info->m_propertyIndex = 0xffff;
          info->m_attributes = '\0';
          info->flags = InlineCacheNoFlags;
          *(undefined1 *)&info->cacheInfoFlag =
               (char)info->cacheInfoFlag | disablePrototypeCacheFlag;
        }
        local_78.threadContext = (ThreadContext *)propertyNameNumericValue;
        local_78.isPropertyNameNumeric = local_48;
        local_78.propertyNameNumericValue = isPropertyNameNumeric;
        uVar1 = *(undefined1 *)((long)propertyNameNumericValue + 0x109);
        *(undefined1 *)((long)propertyNameNumericValue + 0x109) = 1;
        local_78.hasMethod = function;
        local_78.targetObj = (RecyclableObject *)this;
        attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
        bVar5 = ThreadContext::HasNoSideEffect
                          ((ThreadContext *)pvVar4,(RecyclableObject *)function,attributes);
        if (bVar5) {
          ptr = (RecyclableObject *)anon_func::anon_class_48_6_c05621ac::operator()(&local_78);
          bVar5 = ThreadContext::IsOnStack(ptr);
LAB_00a0e50f:
          if (bVar5 != false) {
            *(byte *)((long)pvVar4 + 0x1570) = *(byte *)((long)pvVar4 + 0x1570) | 5;
          }
        }
        else if ((*(byte *)((long)pvVar4 + 0x1542) & 1) == 0) {
          if ((attributes & HasNoSideEffect) != None) {
            ptr = (RecyclableObject *)anon_func::anon_class_48_6_c05621ac::operator()(&local_78);
            bVar5 = ThreadContext::IsOnStack(ptr);
            goto LAB_00a0e50f;
          }
          bVar2 = *(byte *)((long)pvVar4 + 0x1570);
          ptr = (RecyclableObject *)anon_func::anon_class_48_6_c05621ac::operator()(&local_78);
          *(byte *)((long)pvVar4 + 0x1570) = bVar2 | 5;
        }
        else {
          *(byte *)((long)pvVar4 + 0x1570) = *(byte *)((long)pvVar4 + 0x1570) | 5;
          ptr = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                      javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                  super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
                undefinedValue.ptr;
        }
        *(undefined1 *)((long)pvVar4 + 0x109) = uVar1;
        BVar6 = JavascriptConversion::ToBoolean(ptr,pSVar3);
        bVar5 = BVar6 != 0;
        goto LAB_00a0e46e;
      }
    }
  }
  PVar7 = DynamicObject::HasPropertyQuery(&this->super_DynamicObject,propertyId,info);
  bVar5 = PVar7 == Property_Found;
LAB_00a0e46e:
  return (PropertyQueryFlags)bVar5;
}

Assistant:

Js::PropertyQueryFlags CustomExternalWrapperObject::HasPropertyQuery(Js::PropertyId propertyId, _Inout_opt_ Js::PropertyValueInfo* info)
{
    auto fn = [&](RecyclableObject* object)->BOOL {
        return JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::HasPropertyQuery(propertyId, info));
    };
    auto getPropertyName = [&](Js::ScriptContext * requestContext, Js::Var * isPropertyNameNumeric, Js::Var * propertyNameNumericValue)->Js::Var
    {
        return GetName(requestContext, propertyId, isPropertyNameNumeric, propertyNameNumericValue);
    };
    return Js::JavascriptConversion::BooleanToPropertyQueryFlags(HasPropertyTrap(fn, getPropertyName, info));
}